

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O0

bool __thiscall cmListFileParser::ParseFile(cmListFileParser *this)

{
  bool bVar1;
  int iVar2;
  cmListFileLexer_Token *pcVar3;
  ostream *poVar4;
  char *pcVar5;
  string local_3e0;
  ostringstream local_3c0 [8];
  ostringstream error_1;
  string local_248;
  ostringstream local_228 [8];
  ostringstream error;
  cmListFileLexer_Token *token;
  undefined1 local_a0 [6];
  bool haveNewline;
  allocator local_79;
  string local_78;
  allocator local_41;
  string local_40;
  cmListFileLexer_BOM local_1c;
  cmListFileParser *pcStack_18;
  cmListFileLexer_BOM bom;
  cmListFileParser *this_local;
  
  pcStack_18 = this;
  iVar2 = cmListFileLexer_SetFileName(this->Lexer,this->FileName,&local_1c);
  if (iVar2 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_40,"cmListFileCache: error can not open file.",&local_41);
    IssueFileOpenError(this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    this_local._7_1_ = 0;
  }
  else if (local_1c == cmListFileLexer_BOM_Broken) {
    cmListFileLexer_SetFileName(this->Lexer,(char *)0x0,(cmListFileLexer_BOM *)0x0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_78,"Error while reading Byte-Order-Mark. File not seekable?",
               &local_79);
    IssueFileOpenError(this,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    this_local._7_1_ = 0;
  }
  else if ((local_1c == cmListFileLexer_BOM_None) || (local_1c == cmListFileLexer_BOM_UTF8)) {
    token._6_1_ = 1;
    while (pcVar3 = cmListFileLexer_Scan(this->Lexer), pcVar3 != (cmListFileLexer_Token *)0x0) {
      if (pcVar3->type != cmListFileLexer_Token_Space) {
        if (pcVar3->type == cmListFileLexer_Token_Newline) {
          token._6_1_ = 1;
        }
        else if (pcVar3->type == cmListFileLexer_Token_CommentBracket) {
          token._6_1_ = 0;
        }
        else {
          if (pcVar3->type != cmListFileLexer_Token_Identifier) {
            std::__cxx11::ostringstream::ostringstream(local_3c0);
            poVar4 = std::operator<<((ostream *)local_3c0,
                                     "Parse error.  Expected a command name, got ");
            pcVar5 = cmListFileLexer_GetTypeAsString(this->Lexer,pcVar3->type);
            poVar4 = std::operator<<(poVar4,pcVar5);
            poVar4 = std::operator<<(poVar4," with text \"");
            poVar4 = std::operator<<(poVar4,pcVar3->text);
            std::operator<<(poVar4,"\".");
            std::__cxx11::ostringstream::str();
            IssueError(this,&local_3e0);
            std::__cxx11::string::~string((string *)&local_3e0);
            this_local._7_1_ = 0;
            std::__cxx11::ostringstream::~ostringstream(local_3c0);
            goto LAB_0077d700;
          }
          if ((token._6_1_ & 1) == 0) {
            std::__cxx11::ostringstream::ostringstream(local_228);
            poVar4 = std::operator<<((ostream *)local_228,"Parse error.  Expected a newline, got ");
            pcVar5 = cmListFileLexer_GetTypeAsString(this->Lexer,pcVar3->type);
            poVar4 = std::operator<<(poVar4,pcVar5);
            poVar4 = std::operator<<(poVar4," with text \"");
            poVar4 = std::operator<<(poVar4,pcVar3->text);
            std::operator<<(poVar4,"\".");
            std::__cxx11::ostringstream::str();
            IssueError(this,&local_248);
            std::__cxx11::string::~string((string *)&local_248);
            this_local._7_1_ = 0;
            std::__cxx11::ostringstream::~ostringstream(local_228);
            goto LAB_0077d700;
          }
          token._6_1_ = 0;
          bVar1 = ParseFunction(this,pcVar3->text,(long)pcVar3->line);
          if (!bVar1) {
            this_local._7_1_ = 0;
            goto LAB_0077d700;
          }
          std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::push_back
                    (&this->ListFile->Functions,&this->Function);
        }
      }
    }
    this_local._7_1_ = 1;
  }
  else {
    cmListFileLexer_SetFileName(this->Lexer,(char *)0x0,(cmListFileLexer_BOM *)0x0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_a0,"File starts with a Byte-Order-Mark that is not UTF-8.",
               (allocator *)((long)&token + 7));
    IssueFileOpenError(this,(string *)local_a0);
    std::__cxx11::string::~string((string *)local_a0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&token + 7));
    this_local._7_1_ = 0;
  }
LAB_0077d700:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmListFileParser::ParseFile()
{
  // Open the file.
  cmListFileLexer_BOM bom;
  if (!cmListFileLexer_SetFileName(this->Lexer, this->FileName, &bom)) {
    this->IssueFileOpenError("cmListFileCache: error can not open file.");
    return false;
  }

  if (bom == cmListFileLexer_BOM_Broken) {
    cmListFileLexer_SetFileName(this->Lexer, CM_NULLPTR, CM_NULLPTR);
    this->IssueFileOpenError("Error while reading Byte-Order-Mark. "
                             "File not seekable?");
    return false;
  }

  // Verify the Byte-Order-Mark, if any.
  if (bom != cmListFileLexer_BOM_None && bom != cmListFileLexer_BOM_UTF8) {
    cmListFileLexer_SetFileName(this->Lexer, CM_NULLPTR, CM_NULLPTR);
    this->IssueFileOpenError(
      "File starts with a Byte-Order-Mark that is not UTF-8.");
    return false;
  }

  // Use a simple recursive-descent parser to process the token
  // stream.
  bool haveNewline = true;
  while (cmListFileLexer_Token* token = cmListFileLexer_Scan(this->Lexer)) {
    if (token->type == cmListFileLexer_Token_Space) {
    } else if (token->type == cmListFileLexer_Token_Newline) {
      haveNewline = true;
    } else if (token->type == cmListFileLexer_Token_CommentBracket) {
      haveNewline = false;
    } else if (token->type == cmListFileLexer_Token_Identifier) {
      if (haveNewline) {
        haveNewline = false;
        if (this->ParseFunction(token->text, token->line)) {
          this->ListFile->Functions.push_back(this->Function);
        } else {
          return false;
        }
      } else {
        std::ostringstream error;
        error << "Parse error.  Expected a newline, got "
              << cmListFileLexer_GetTypeAsString(this->Lexer, token->type)
              << " with text \"" << token->text << "\".";
        this->IssueError(error.str());
        return false;
      }
    } else {
      std::ostringstream error;
      error << "Parse error.  Expected a command name, got "
            << cmListFileLexer_GetTypeAsString(this->Lexer, token->type)
            << " with text \"" << token->text << "\".";
      this->IssueError(error.str());
      return false;
    }
  }
  return true;
}